

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

void __thiscall
cmFileCommand::AddEvaluationFile
          (cmFileCommand *this,string *inputName,string *outputExpr,string *condition,
          bool inputIsContent)

{
  undefined7 in_register_00000081;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  conditionCge;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  outputCge;
  cmGeneratorExpression conditionGe;
  cmGeneratorExpression outputGe;
  cmListFileBacktrace lfbt;
  undefined1 local_a8 [20];
  undefined4 local_94;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_90;
  __uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
  local_88;
  undefined1 local_80 [32];
  undefined1 local_60 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_94 = (undefined4)CONCAT71(in_register_00000081,inputIsContent);
  cmMakefile::GetBacktrace((cmMakefile *)local_60);
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_40,
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)local_60)
  ;
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)(local_80 + 0x10),(cmListFileBacktrace *)&local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)(local_a8 + 8),(string *)(local_80 + 0x10));
  std::__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)
             (local_60 + 0x10),
             (__shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2> *)local_60)
  ;
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_80,(cmListFileBacktrace *)(local_60 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_a8,(string *)local_80);
  local_88._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>)
       (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>)
       local_a8._8_8_;
  local_a8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_90._M_t.
  super__Tuple_impl<0UL,_cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>
  .super__Head_base<0UL,_cmCompiledGeneratorExpression_*,_false>._M_head_impl =
       (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>)
       (tuple<cmCompiledGeneratorExpression_*,_std::default_delete<cmCompiledGeneratorExpression>_>)
       local_a8._0_8_;
  local_a8._0_8_ =
       (__uniq_ptr_impl<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
        )0x0;
  cmMakefile::AddEvaluationFile
            ((this->super_cmCommand).Makefile,inputName,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&local_88,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)&local_90,local_94._0_1_);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_90);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)&local_88);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_a8);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_80);
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)(local_a8 + 8));
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)(local_80 + 0x10));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_60 + 8));
  return;
}

Assistant:

void cmFileCommand::AddEvaluationFile(const std::string& inputName,
                                      const std::string& outputExpr,
                                      const std::string& condition,
                                      bool inputIsContent)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();

  cmGeneratorExpression outputGe(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> outputCge =
    outputGe.Parse(outputExpr);

  cmGeneratorExpression conditionGe(lfbt);
  std::unique_ptr<cmCompiledGeneratorExpression> conditionCge =
    conditionGe.Parse(condition);

  this->Makefile->AddEvaluationFile(inputName, std::move(outputCge),
                                    std::move(conditionCge), inputIsContent);
}